

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnaryPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnaryPropertyExprSyntax,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,PropertyExprSyntax *args_1)

{
  Token op;
  UnaryPropertyExprSyntax *this_00;
  PropertyExprSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (UnaryPropertyExprSyntax *)allocate(this,0x28,8);
  op.kind = args->kind;
  op._2_1_ = args->field_0x2;
  op.numFlags.raw = (args->numFlags).raw;
  op.rawLen = args->rawLen;
  op.info = args->info;
  slang::syntax::UnaryPropertyExprSyntax::UnaryPropertyExprSyntax(this_00,op,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }